

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_client_async.cpp
# Opt level: O0

void __thiscall Client::Client(Client *this,io_context *io_context,string *host,string *port)

{
  string *service;
  string *host_00;
  Client *local_68;
  code *local_60;
  undefined8 local_58;
  type local_50;
  protocol_type local_38 [4];
  string *local_28;
  string *port_local;
  string *host_local;
  io_context *io_context_local;
  Client *this_local;
  
  local_28 = port;
  port_local = host;
  host_local = (string *)io_context;
  io_context_local = (io_context *)this;
  boost::asio::
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_stream_socket<boost::asio::io_context>(&this->socket_,io_context,(type *)0x0);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_resolver<boost::asio::io_context>(&this->resolver_,(io_context *)host_local,(type *)0x0);
  local_38[0].family_ = (int)boost::asio::ip::tcp::v4();
  host_00 = port_local;
  service = local_28;
  local_60 = OnResolve;
  local_58 = 0;
  local_68 = this;
  std::
  bind<void(Client::*)(boost::system::error_code,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>),Client*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_50,(offset_in_Client_to_subr *)&local_60,&local_68,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_resolve<std::_Bind<void(Client::*(Client*,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code,boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>)>>
            ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&this->resolver_,local_38,host_00,service,&local_50);
  return;
}

Assistant:

Client::Client(boost::asio::io_context& io_context,
               const std::string& host, const std::string& port)
#if RESOLVE_ASYNC
    : socket_(io_context), resolver_(io_context) {
#else
    : socket_(io_context) {
#endif

#if RESOLVE_ASYNC

  resolver_.async_resolve(tcp::v4(), host, port,
                          std::bind(&Client::OnResolve, this,
                                    std::placeholders::_1,
                                    std::placeholders::_2));

#else

  // If you don't specify tcp::v4() as the first parameter (protocol) of
  // resolve(), the result will have two endpoints, one for v6, one for
  // v4. The first v6 endpoint will fail to connect.

  tcp::resolver resolver(io_context);

#if RESOLVE_IPV4_ONLY

  auto endpoints = resolver.resolve(tcp::v4(), host, port);
  // 127.0.0.1:2017, v4

#else

  auto endpoints = resolver.resolve(host, port);
  // [::1]:2017, v6
  // 127.0.0.1:2017, v4

#endif  // RESOLVE_IPV4_ONLY

  utility::PrintEndpoints(std::cout, endpoints);

  // ConnectHandler: void(boost::system::error_code, tcp::endpoint)
  boost::asio::async_connect(socket_, endpoints,
                             std::bind(&Client::OnConnect, this,
                                       std::placeholders::_1,
                                       std::placeholders::_2));

#endif  // RESOLVE_ASYNC
}